

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active.cc
# Opt level: O0

void predict_or_learn_simulation<true>(active *a,single_learner *base,example *ec)

{
  active *in_RDX;
  long in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float importance;
  float threshold;
  float k;
  vw *all;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffdc;
  learner<char,_example> *in_stack_ffffffffffffffe0;
  learner<char,_example> *this;
  
  LEARNER::learner<char,_example>::predict
            (in_stack_ffffffffffffffe0,
             (example *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  this = *(learner<char,_example> **)(in_RDI + 8);
  fVar1 = (float)*(double *)(*(long *)this + 0x18);
  uVar4 = 0;
  fVar2 = in_RDX[0x685].active_c0 - 0.0;
  fVar3 = ABS(fVar2);
  fVar2 = LEARNER::learner<char,_example>::sensitivity
                    (this,(example *)((ulong)(uint)fVar1 << 0x20),
                     CONCAT44(in_stack_ffffffffffffffd4,fVar2) & 0xffffffff7fffffff);
  *(float *)&in_RDX[0x68b].all = fVar3 / fVar2;
  fVar2 = query_decision(in_RDX,(float)((ulong)this >> 0x20),SUB84(this,0));
  if (fVar2 <= 0.0) {
    *(undefined4 *)&in_RDX[0x682].all = 0x7f7fffff;
    in_RDX[0x687].active_c0 = 0.0;
  }
  else {
    **(long **)this = **(long **)this + 1;
    in_RDX[0x687].active_c0 = fVar2 * in_RDX[0x687].active_c0;
    LEARNER::learner<char,_example>::learn
              (this,(example *)CONCAT44(fVar1,uVar4),CONCAT44(fVar2,fVar3));
  }
  return;
}

Assistant:

void predict_or_learn_simulation(active& a, single_learner& base, example& ec)
{
  base.predict(ec);

  if (is_learn)
  {
    vw& all = *a.all;

    float k = (float)all.sd->t;
    float threshold = 0.f;

    ec.confidence = fabsf(ec.pred.scalar - threshold) / base.sensitivity(ec);
    float importance = query_decision(a, ec.confidence, k);

    if (importance > 0)
    {
      all.sd->queries += 1;
      ec.weight *= importance;
      base.learn(ec);
    }
    else
    {
      ec.l.simple.label = FLT_MAX;
      ec.weight = 0.f;
    }
  }
}